

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  __sighandler_t extraout_RAX;
  __sighandler_t p_Var4;
  undefined8 extraout_RAX_00;
  bool skipHeader;
  bool bVar5;
  FILE *fout [2];
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parquetOutFiles;
  sigaction sa;
  allocator local_195;
  int local_194;
  undefined8 local_190;
  string local_188;
  string local_168;
  FILE *local_148;
  undefined8 uStack_140;
  string local_138;
  string local_118;
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  _union_1457 local_c8;
  undefined1 local_c0 [128];
  undefined4 local_40;
  
  progname = *argv;
  local_148 = (FILE *)0x0;
  uStack_140 = 0;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f8._M_impl.super__Rb_tree_header._M_header;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar5 = false;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_190 = 0;
  local_194 = 0;
  bVar2 = false;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    while( true ) {
      do {
        skipHeader = bVar2;
        iVar3 = getopt(argc,argv,"vshP:M:m:Q:q:");
        bVar2 = true;
      } while (iVar3 == 0x73);
      if (0x50 < iVar3) break;
      if (iVar3 == -1) {
        if (!bVar5) {
          memset(&local_c8,0,0x98);
          sigemptyset((sigset_t *)local_c0);
          local_c8.sa_handler = segfault_sigaction;
          local_40 = 4;
          sigaction(0xb,(sigaction *)&local_c8,(sigaction *)0x0);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
          initstreams(&local_118,&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          eltcalc::setinitdone(local_194);
          std::__cxx11::string::string((string *)&local_188,progname,&local_195);
          paVar1 = &local_168.field_2;
          local_168._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"INFO","");
          logprintf(&local_188,&local_168,"starting process..\n");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != paVar1) {
            operator_delete(local_168._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p);
          }
          eltcalc::doit(skipHeader,(bool)((byte)local_190 & 1),&local_148,
                        (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_f8);
          std::__cxx11::string::string((string *)&local_188,progname,&local_195);
          local_168._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"INFO","");
          logprintf(&local_188,&local_168,"finishing process..\n");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != paVar1) {
            operator_delete(local_168._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p);
          }
          std::
          _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_f8);
          return 0;
        }
        goto LAB_00104985;
      }
      if (iVar3 == 0x4d) {
        std::__cxx11::string::string((string *)&local_c8,_optarg,(allocator *)&local_188);
        iVar3 = 0;
LAB_00104753:
        openpipe(iVar3,(string *)&local_c8,&local_148);
        p_Var4 = (__sighandler_t)(local_c0 + 8);
        if (local_c8.sa_handler != p_Var4) {
          operator_delete(local_c8.sa_handler);
          p_Var4 = extraout_RAX;
        }
        local_190 = CONCAT71((int7)((ulong)p_Var4 >> 8),1);
        bVar2 = skipHeader;
      }
      else {
        if (iVar3 != 0x50) goto LAB_00104980;
        local_194 = atoi(_optarg);
        bVar2 = skipHeader;
      }
    }
    if (iVar3 < 0x71) {
      if (iVar3 == 0x51) {
        std::__cxx11::string::string((string *)&local_c8,_optarg,(allocator *)&local_188);
        iVar3 = 1;
        goto LAB_00104753;
      }
      if (iVar3 != 0x6d) goto LAB_00104980;
    }
    else if (iVar3 != 0x71) {
      if (iVar3 == 0x76) {
        main_cold_1();
      }
LAB_00104980:
      main_cold_4();
LAB_00104985:
      main_cold_3();
      std::
      _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_f8);
      _Unwind_Resume(extraout_RAX_00);
    }
    bVar5 = true;
    bVar2 = skipHeader;
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
	progname = argv[0];

	enum { MELT = 0, QELT };

	bool skipHeader = false;
	bool ordOutput = false;
	FILE * fout[] = { nullptr, nullptr };
	bool parquetOutput = false;
	std::map<int, std::string> parquetOutFiles;
	int opt;
	int processid = 0;
	while ((opt = getopt(argc, argv, "vshP:M:m:Q:q:")) != -1) {
		switch (opt) {
		case 'v':
#ifdef HAVE_PARQUET
			fprintf(stderr, "%s : version: %s : "
					"Parquet output enabled\n",
				argv[0], VERSION);
#else
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
#endif
			exit(EXIT_FAILURE);
			break;
		case 'M':
			ordOutput = true;
			openpipe(MELT, optarg, fout);
			break;
		case 'm':
			parquetOutput = true;
#ifdef HAVE_PARQUET
			parquetOutFiles[OasisParquet::MELT] = optarg;
#endif
			break;
		case 'Q':
			ordOutput = true;
			openpipe(QELT, optarg, fout);
			break;
		case 'q':
			parquetOutput = true;
#ifdef HAVE_PARQUET
			parquetOutFiles[OasisParquet::QELT] = optarg;
#endif
			break;
		case 'P':
			processid = atoi(optarg);
			break;
		case 's':
			skipHeader = true;
			break;
		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}

#ifndef HAVE_PARQUET
	if (parquetOutput) {
		fprintf(stderr, "FATAL: Apache arrow libraries for parquet "
				"output are missing.\nPlease install libraries "
				"and recompile to use this option.\n");
		exit(EXIT_FAILURE);
	}
#endif

#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif
	try {
		initstreams();
		eltcalc::setinitdone(processid);
        	logprintf(progname, "INFO", "starting process..\n");
		eltcalc::doit(skipHeader, ordOutput, fout, parquetOutFiles);
        	logprintf(progname, "INFO", "finishing process..\n");
		return EXIT_SUCCESS;
	}
	catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}

}